

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_dispatcher_template.hpp
# Opt level: O0

void __thiscall
so_5::disp::reuse::
proxy_dispatcher_template_t<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>,so_5::disp::thread_pool::disp_params_t>
::
make_actual_dispatcher<so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>,so_5::environment_t,unsigned_long,so_5::disp::mpmc_queue_traits::queue_params_t_const&>
          (proxy_dispatcher_template_t<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>,so_5::disp::thread_pool::disp_params_t>
           *this,environment_t *env,unsigned_long *args,queue_params_t *args_1)

{
  pointer peVar1;
  unique_ptr<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>_>_>
  local_30;
  unique_ptr<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>_>_>
  disp;
  queue_params_t *args_local_1;
  unsigned_long *args_local;
  environment_t *env_local;
  proxy_dispatcher_template_t<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>,_so_5::disp::thread_pool::disp_params_t>
  *this_local;
  
  disp._M_t.
  super___uniq_ptr_impl<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>_*,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>_>_>
  .
  super__Head_base<0UL,_so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>_>,_true,_true>
        )(__uniq_ptr_data<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>_>,_true,_true>
          )args_1;
  stats::activity_tracking_stuff::
  create_appropriate_disp<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>,so_5::environment_t,so_5::disp::thread_pool::disp_params_t,unsigned_long,so_5::disp::mpmc_queue_traits::queue_params_t_const&>
            ((activity_tracking_stuff *)&local_30,env,(disp_params_t *)(this + 0x10),args,args_1);
  peVar1 = std::
           unique_ptr<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>_>_>
           ::operator->(&local_30);
  (*(peVar1->super_dispatcher_t)._vptr_dispatcher_t[5])(peVar1,this + 0x48);
  peVar1 = std::
           unique_ptr<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>_>_>
           ::operator->(&local_30);
  (*(peVar1->super_dispatcher_t)._vptr_dispatcher_t[2])(peVar1,env);
  std::
  unique_ptr<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>_>_>
  ::operator=((unique_ptr<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>_>_>
               *)(this + 8),&local_30);
  std::
  unique_ptr<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>_>_>
  ::~unique_ptr(&local_30);
  return;
}

Assistant:

void
		make_actual_dispatcher(
			ENV & env,
			ARGS && ...args )
			{
				using so_5::stats::activity_tracking_stuff::create_appropriate_disp;
				auto disp = create_appropriate_disp<
						DISP_IFACE_TYPE,
						DISP_NO_TRACKING,
						DISP_WITH_TRACKING >(
					env,
					m_disp_params,
					std::forward<ARGS>(args)... );

				disp->set_data_sources_name_base( m_data_source_base_name );
				disp->start( env );

				m_disp = std::move( disp );
			}